

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_backtrace.cpp
# Opt level: O2

int foo(void)

{
  runtime_error *this;
  allocator local_39;
  string local_38;
  
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"My Error",&local_39);
  booster::runtime_error::runtime_error(this,&local_38);
  __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

int foo()
{
	throw booster::runtime_error("My Error");
	return 10;
}